

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_metal_resource_index
          (CompilerMSL *this,SPIRVariable *var,BaseType basetype,uint32_t plane)

{
  bool bVar1;
  uint32_t uVar2;
  SPIREntryPoint *pSVar3;
  mapped_type *pmVar4;
  SPIRType *pSVar5;
  pointer ppVar6;
  size_t sVar7;
  bool local_b1;
  uint32_t local_b0;
  uint32_t local_ac;
  uint32_t local_9c;
  uint local_98;
  uint32_t resource_index;
  uint32_t i;
  uint32_t binding_stride;
  bool allocate_argument_buffer_ids;
  SPIRType *type;
  pair<spirv_cross::MSLResourceBinding,_bool> *remap;
  ExtendedDecorations local_64;
  bool local_5d;
  ExtendedDecorations resource_decoration;
  uint32_t uStack_58;
  bool use_secondary_binding;
  uint32_t local_54;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
  local_50;
  iterator itr;
  uint32_t var_binding;
  uint32_t var_desc_set;
  SPIRType *var_type;
  Decoration *var_dec;
  SPIREntryPoint *execution;
  uint32_t plane_local;
  BaseType basetype_local;
  SPIRVariable *var_local;
  CompilerMSL *this_local;
  
  pSVar3 = Compiler::get_entry_point((Compiler *)this);
  pmVar4 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  if (var->storage == PushConstant) {
    local_ac = 0xffffffff;
  }
  else {
    local_ac = (pmVar4->decoration).set;
  }
  itr.
  super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
  ._M_cur._4_4_ = local_ac;
  if (var->storage == PushConstant) {
    local_b0 = 0;
  }
  else {
    local_b0 = (pmVar4->decoration).binding;
  }
  itr.
  super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
  ._M_cur._0_4_ = local_b0;
  resource_decoration = pSVar3->model;
  uStack_58 = local_ac;
  local_54 = local_b0;
  local_50._M_cur =
       (__node_type *)
       ::std::
       unordered_map<spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>_>
       ::find(&this->resource_bindings,(key_type *)&resource_decoration);
  if ((pSVar5->basetype != SampledImage) || (local_b1 = true, basetype != Sampler)) {
    local_b1 = basetype == AtomicCounter;
  }
  local_5d = local_b1;
  local_64 = SPIRVCrossDecorationResourceIndexPrimary;
  if (local_b1 != false) {
    local_64 = SPIRVCrossDecorationResourceIndexSecondary;
  }
  if (plane == 1) {
    local_64 = SPIRVCrossDecorationResourceIndexTertiary;
  }
  if (plane == 2) {
    local_64 = SPIRVCrossDecorationResourceIndexQuaternary;
  }
  remap = (pair<spirv_cross::MSLResourceBinding,_bool> *)
          ::std::
          end<std::unordered_map<spirv_cross::StageSetBinding,std::pair<spirv_cross::MSLResourceBinding,bool>,spirv_cross::InternalHasher,std::equal_to<spirv_cross::StageSetBinding>,std::allocator<std::pair<spirv_cross::StageSetBinding_const,std::pair<spirv_cross::MSLResourceBinding,bool>>>>>
                    (&this->resource_bindings);
  bVar1 = ::std::__detail::operator!=
                    (&local_50,
                     (_Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                      *)&remap);
  if (bVar1) {
    ppVar6 = ::std::__detail::
             _Node_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_false,_true>
                           *)&local_50);
    (ppVar6->second).second = true;
    if (basetype == Image) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      Compiler::set_extended_decoration
                ((Compiler *)this,uVar2,local_64,(ppVar6->second).first.msl_texture + plane);
      this_local._4_4_ = (ppVar6->second).first.msl_texture + plane;
    }
    else if (basetype == Sampler) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      Compiler::set_extended_decoration
                ((Compiler *)this,uVar2,local_64,(ppVar6->second).first.msl_sampler);
      this_local._4_4_ = (ppVar6->second).first.msl_sampler;
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      Compiler::set_extended_decoration
                ((Compiler *)this,uVar2,local_64,(ppVar6->second).first.msl_buffer);
      this_local._4_4_ = (ppVar6->second).first.msl_buffer;
    }
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
    bVar1 = Compiler::has_extended_decoration((Compiler *)this,uVar2,local_64);
    if (bVar1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      this_local._4_4_ = Compiler::get_extended_decoration((Compiler *)this,uVar2,local_64);
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
      pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      bVar1 = type_is_msl_framebuffer_fetch(this,pSVar5);
      if (bVar1) {
        this_local._4_4_ =
             Compiler::get_decoration
                       ((Compiler *)this,(ID)(var->super_IVariant).self.id,
                        DecorationInputAttachmentIndex);
      }
      else if (((((this->msl_options).enable_decoration_binding & 1U) == 0) ||
               (bVar1 = Compiler::has_decoration
                                  ((Compiler *)this,(ID)(var->super_IVariant).self.id,Binding),
               !bVar1)) ||
              (itr.
               super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
               ._M_cur._0_4_ =
                    Compiler::get_decoration
                              ((Compiler *)this,(ID)(var->super_IVariant).self.id,Binding),
              this_local._4_4_ =
                   (uint32_t)
                   itr.
                   super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                   ._M_cur,
              0x7fffffff <
              (uint32_t)
              itr.
              super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
              ._M_cur)) {
        i._3_1_ = false;
        if (var->storage != PushConstant) {
          i._3_1_ = descriptor_set_is_argument_buffer
                              (this,itr.
                                    super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                                    ._M_cur._4_4_);
        }
        resource_index = 1;
        for (local_98 = 0;
            sVar7 = VectorView<unsigned_int>::size(&(pSVar5->array).super_VectorView<unsigned_int>),
            local_98 < (uint)sVar7; local_98 = local_98 + 1) {
          uVar2 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar5,local_98);
          resource_index = uVar2 * resource_index;
        }
        if (i._3_1_ == false) {
          bVar1 = is_var_runtime_size_array(this,var);
          execution._4_4_ = basetype;
          if (bVar1) {
            execution._4_4_ = Struct;
            resource_index = 1;
          }
          if (execution._4_4_ == Image) {
            local_9c = this->next_metal_resource_index_texture;
            this->next_metal_resource_index_texture =
                 resource_index + this->next_metal_resource_index_texture;
          }
          else if (execution._4_4_ == Sampler) {
            local_9c = this->next_metal_resource_index_sampler;
            this->next_metal_resource_index_sampler =
                 resource_index + this->next_metal_resource_index_sampler;
          }
          else {
            local_9c = this->next_metal_resource_index_buffer;
            this->next_metal_resource_index_buffer =
                 resource_index + this->next_metal_resource_index_buffer;
          }
        }
        else {
          local_9c = this->next_metal_resource_ids
                     [itr.
                      super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                      ._M_cur._4_4_];
          this->next_metal_resource_ids
          [itr.
           super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
           ._M_cur._4_4_] =
               resource_index +
               this->next_metal_resource_ids
               [itr.
                super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                ._M_cur._4_4_];
        }
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        Compiler::set_extended_decoration((Compiler *)this,uVar2,local_64,local_9c);
        this_local._4_4_ = local_9c;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_metal_resource_index(SPIRVariable &var, SPIRType::BaseType basetype, uint32_t plane)
{
	auto &execution = get_entry_point();
	auto &var_dec = ir.meta[var.self].decoration;
	auto &var_type = get<SPIRType>(var.basetype);
	uint32_t var_desc_set = (var.storage == StorageClassPushConstant) ? kPushConstDescSet : var_dec.set;
	uint32_t var_binding = (var.storage == StorageClassPushConstant) ? kPushConstBinding : var_dec.binding;

	// If a matching binding has been specified, find and use it.
	auto itr = resource_bindings.find({ execution.model, var_desc_set, var_binding });

	// Atomic helper buffers for image atomics need to use secondary bindings as well.
	bool use_secondary_binding = (var_type.basetype == SPIRType::SampledImage && basetype == SPIRType::Sampler) ||
	                             basetype == SPIRType::AtomicCounter;

	auto resource_decoration =
	    use_secondary_binding ? SPIRVCrossDecorationResourceIndexSecondary : SPIRVCrossDecorationResourceIndexPrimary;

	if (plane == 1)
		resource_decoration = SPIRVCrossDecorationResourceIndexTertiary;
	if (plane == 2)
		resource_decoration = SPIRVCrossDecorationResourceIndexQuaternary;

	if (itr != end(resource_bindings))
	{
		auto &remap = itr->second;
		remap.second = true;
		switch (basetype)
		{
		case SPIRType::Image:
			set_extended_decoration(var.self, resource_decoration, remap.first.msl_texture + plane);
			return remap.first.msl_texture + plane;
		case SPIRType::Sampler:
			set_extended_decoration(var.self, resource_decoration, remap.first.msl_sampler);
			return remap.first.msl_sampler;
		default:
			set_extended_decoration(var.self, resource_decoration, remap.first.msl_buffer);
			return remap.first.msl_buffer;
		}
	}

	// If we have already allocated an index, keep using it.
	if (has_extended_decoration(var.self, resource_decoration))
		return get_extended_decoration(var.self, resource_decoration);

	auto &type = get<SPIRType>(var.basetype);

	if (type_is_msl_framebuffer_fetch(type))
	{
		// Frame-buffer fetch gets its fallback resource index from the input attachment index,
		// which is then treated as color index.
		return get_decoration(var.self, DecorationInputAttachmentIndex);
	}
	else if (msl_options.enable_decoration_binding)
	{
		// Allow user to enable decoration binding.
		// If there is no explicit mapping of bindings to MSL, use the declared binding as a fallback.
		if (has_decoration(var.self, DecorationBinding))
		{
			var_binding = get_decoration(var.self, DecorationBinding);
			// Avoid emitting sentinel bindings.
			if (var_binding < 0x80000000u)
				return var_binding;
		}
	}

	// If we did not explicitly remap, allocate bindings on demand.
	// We cannot reliably use Binding decorations since SPIR-V and MSL's binding models are very different.

	bool allocate_argument_buffer_ids = false;

	if (var.storage != StorageClassPushConstant)
		allocate_argument_buffer_ids = descriptor_set_is_argument_buffer(var_desc_set);

	uint32_t binding_stride = 1;
	for (uint32_t i = 0; i < uint32_t(type.array.size()); i++)
		binding_stride *= to_array_size_literal(type, i);

	// If a binding has not been specified, revert to incrementing resource indices.
	uint32_t resource_index;

	if (allocate_argument_buffer_ids)
	{
		// Allocate from a flat ID binding space.
		resource_index = next_metal_resource_ids[var_desc_set];
		next_metal_resource_ids[var_desc_set] += binding_stride;
	}
	else
	{
		if (is_var_runtime_size_array(var))
		{
			basetype = SPIRType::Struct;
			binding_stride = 1;
		}
		// Allocate from plain bindings which are allocated per resource type.
		switch (basetype)
		{
		case SPIRType::Image:
			resource_index = next_metal_resource_index_texture;
			next_metal_resource_index_texture += binding_stride;
			break;
		case SPIRType::Sampler:
			resource_index = next_metal_resource_index_sampler;
			next_metal_resource_index_sampler += binding_stride;
			break;
		default:
			resource_index = next_metal_resource_index_buffer;
			next_metal_resource_index_buffer += binding_stride;
			break;
		}
	}

	set_extended_decoration(var.self, resource_decoration, resource_index);
	return resource_index;
}